

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackNameLengthValidator::validateVariable
          (TransformFeedbackNameLengthValidator *this,string *implementationName,GLint propValue)

{
  ostringstream *poVar1;
  TestContext *this_00;
  size_type sVar2;
  int iVar3;
  undefined1 local_1a8 [16];
  TestLog local_198 [13];
  ios_base local_130 [264];
  
  sVar2 = implementationName->_M_string_length;
  local_1a8._0_8_ =
       ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying name length, expecting ",0x21);
  iVar3 = (int)sVar2 + 1;
  std::ostream::operator<<(poVar1,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (",2);
  std::ostream::operator<<(poVar1,(int)implementationName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," for \"",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(implementationName->_M_dataplus)._M_p,
             implementationName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"\" + 1 byte for terminating null character)",0x2a);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  if (iVar3 != propValue) {
    local_1a8._0_8_ =
         ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tError, invalid name length, got ",0x21);
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"name length invalid","");
    this_00 = (this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx;
    if (this_00->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_1a8._0_8_);
    }
    if ((TestLog *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)((long)&(local_198[0].m_log)->flags + 1));
    }
  }
  return;
}

Assistant:

void TransformFeedbackNameLengthValidator::validateVariable (const std::string& implementationName, glw::GLint propValue) const
{
	const int expected = (int)implementationName.length() + 1; // includes null byte
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying name length, expecting " << expected << " (" << (int)implementationName.length() << " for \"" << implementationName << "\" + 1 byte for terminating null character)" << tcu::TestLog::EndMessage;

	if (propValue != expected)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid name length, got " << propValue << tcu::TestLog::EndMessage;
		setError("name length invalid");
	}
}